

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageChannelValues * __thiscall
pbrt::Image::LookupNearest
          (ImageChannelValues *__return_storage_ptr__,Image *this,Point2f p,ImageChannelDesc *desc,
          WrapMode2D wrapMode)

{
  undefined1 auVar1 [16];
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar3;
  Tuple2<pbrt::Point2,_int> p_00;
  ulong uVar4;
  Float FVar5;
  undefined8 in_XMM0_Qb;
  float local_5c;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  polymorphic_allocator<float> local_38;
  
  p_00 = (Tuple2<pbrt::Point2,_int>)(desc->offset).nStored;
  local_58 = p.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_54 = p.super_Tuple2<pbrt::Point2,_float>.y;
  local_5c = 0.0;
  uStack_50 = in_XMM0_Qb;
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
            (&__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,(size_t)p_00,
             &local_5c,&local_38);
  if ((desc->offset).nStored != 0) {
    auVar1._4_4_ = fStack_54;
    auVar1._0_4_ = local_58;
    auVar1._8_8_ = uStack_50;
    local_48 = vmovshdup_avx(auVar1);
    uVar4 = 0;
    do {
      paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                *)(desc->offset).ptr;
      if (paVar2 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                     *)0x0) {
        paVar2 = &(desc->offset).field_2;
      }
      p_00 = (Tuple2<pbrt::Point2,_int>)
             (CONCAT44(p_00.y,(int)((float)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x *
                                   local_58)) |
             (ulong)(uint)(int)((float)(this->resolution).super_Tuple2<pbrt::Point2,_int>.y *
                               (float)local_48._0_4_) << 0x20);
      FVar5 = GetChannel(this,(Point2i)p_00,paVar2->fixed[uVar4],wrapMode);
      paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      if (paVar3 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar3 = &(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      }
      paVar3->fixed[uVar4] = FVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (desc->offset).nStored);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::LookupNearest(Point2f p, const ImageChannelDesc &desc,
                                        WrapMode2D wrapMode) const {
    ImageChannelValues cv(desc.offset.size(), Float(0));
    for (int i = 0; i < desc.offset.size(); ++i)
        cv[i] = LookupNearestChannel(p, desc.offset[i], wrapMode);
    return cv;
}